

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Generators<LargeNumbers> * __thiscall
Catch::Generators::makeGenerators<LargeNumbers,LargeNumbers>
          (Generators<LargeNumbers> *__return_storage_ptr__,Generators *this,LargeNumbers *val,
          LargeNumbers *moreGenerators)

{
  long *local_20;
  
  value<LargeNumbers>((Generators *)&local_20,(LargeNumbers *)this);
  Generators<LargeNumbers>::
  Generators<Catch::Generators::GeneratorWrapper<LargeNumbers>,LargeNumbers>
            (__return_storage_ptr__,(GeneratorWrapper<LargeNumbers> *)&local_20,val);
  if (local_20 != (long *)0x0) {
    (**(code **)(*local_20 + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }